

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O1

int archive_read_support_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  archive_read_filter_bidder *in_RAX;
  program_bidder *state;
  char *pcVar2;
  void *__dest;
  archive_read_filter_bidder *bidder;
  archive_read_filter_bidder *local_38;
  
  local_38 = in_RAX;
  iVar1 = __archive_read_get_bidder((archive_read *)_a,&local_38);
  if (iVar1 == 0) {
    state = (program_bidder *)calloc(1,0x28);
    if (state != (program_bidder *)0x0) {
      pcVar2 = strdup(cmd);
      state->cmd = pcVar2;
      if (pcVar2 != (char *)0x0) {
        if (signature_len != 0 && signature != (void *)0x0) {
          state->signature_len = signature_len;
          __dest = malloc(signature_len);
          state->signature = __dest;
          memcpy(__dest,signature,signature_len);
        }
        local_38->data = state;
        local_38->bid = program_bidder_bid;
        local_38->init = program_bidder_init;
        local_38->options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
        local_38->free = program_bidder_free;
        return 0;
      }
    }
    free_state(state);
    archive_set_error(_a,0xc,"Can\'t allocate memory");
  }
  return -0x1e;
}

Assistant:

int
archive_read_support_filter_program_signature(struct archive *_a,
    const char *cmd, const void *signature, size_t signature_len)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter_bidder *bidder;
	struct program_bidder *state;

	/*
	 * Get a bidder object from the read core.
	 */
	if (__archive_read_get_bidder(a, &bidder) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Allocate our private state.
	 */
	state = (struct program_bidder *)calloc(1, sizeof (*state));
	if (state == NULL)
		goto memerr;
	state->cmd = strdup(cmd);
	if (state->cmd == NULL)
		goto memerr;

	return set_bidder_signature(bidder, state, signature, signature_len);
memerr:
	free_state(state);
	archive_set_error(_a, ENOMEM, "Can't allocate memory");
	return (ARCHIVE_FATAL);
}